

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O1

void __thiscall asl::Var::Var(Var *this,uint y)

{
  if (-1 < (int)y) {
    this->_type = INT;
    (this->field_1)._i = y;
    return;
  }
  this->_type = NUMBER;
  (this->field_1)._d = (double)y;
  return;
}

Assistant:

Var::Var(unsigned y)
{
	if (y < 2147483648u) {
		_type = INT;
		_i = (int)y;
	}
	else {
		_type = NUMBER;
		_d = (double)y;
	}
}